

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowest_lexicography.cpp
# Opt level: O0

int si9ma::cmp(void *param_1,void *param_2)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 local_58 [32];
  undefined1 local_38 [40];
  string *str2_local;
  string *str1_local;
  
  local_38._32_8_ = param_2;
  str2_local = (string *)param_1;
  std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)local_38,
                 (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)param_1,
                 (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)param_2);
  std::operator+((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)local_58,
                 (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                  *)local_38._32_8_,str2_local);
  bVar1 = std::operator<((_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          *)local_38,
                         (_Hash_node<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  uVar2 = std::__cxx11::string::~string((string *)local_38);
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),bVar1);
}

Assistant:

bool cmp(const string &str1,const string &str2){
        return str1 + str2 < str2 + str1;
    }